

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O3

void duckdb::Node15Leaf::ShrinkNode256Leaf(ART *art,Node *node15_leaf,Node *node256_leaf)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  idx_t iVar3;
  idx_t iVar4;
  BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *pBVar5;
  type paVar6;
  iterator iVar7;
  pointer this;
  data_ptr_t pdVar8;
  byte bVar9;
  ulong uVar10;
  ulong local_38;
  
  pBVar5 = BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::New(art,node15_leaf);
  uVar1 = (node256_leaf->super_IndexPointer).data;
  paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar6->_M_elems[8].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_38 = uVar1 & 0xffffffff;
  iVar7 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var2._M_head_impl)->buffers)._M_h,&local_38);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar8 = FixedSizeBuffer::Get(this,true);
  iVar3 = (_Var2._M_head_impl)->segment_size;
  iVar4 = (_Var2._M_head_impl)->bitmask_offset;
  (node15_leaf->super_IndexPointer).data =
       (node256_leaf->super_IndexPointer).data & 0x8000000000000000 |
       (node15_leaf->super_IndexPointer).data & 0x7fffffffffffffff;
  bVar9 = pBVar5->count;
  uVar10 = 0;
  do {
    if ((*(ulong *)(pdVar8 + (uVar10 >> 6) * 8 +
                             iVar4 + ((uint)(uVar1 >> 0x20) & 0xffffff) * iVar3 + 8) >>
         (uVar10 & 0x3f) & 1) != 0) {
      pBVar5->key[bVar9] = (uint8_t)uVar10;
      bVar9 = bVar9 + 1;
      pBVar5->count = bVar9;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x100);
  Node::Free(art,node256_leaf);
  return;
}

Assistant:

void Node15Leaf::ShrinkNode256Leaf(ART &art, Node &node15_leaf, Node &node256_leaf) {
	auto &n15 = New(art, node15_leaf);
	auto &n256 = Node::Ref<Node256Leaf>(art, node256_leaf, NType::NODE_256_LEAF);
	node15_leaf.SetGateStatus(node256_leaf.GetGateStatus());

	ValidityMask mask(&n256.mask[0], Node256::CAPACITY);
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		if (mask.RowIsValid(i)) {
			n15.key[n15.count] = UnsafeNumericCast<uint8_t>(i);
			n15.count++;
		}
	}

	Node::Free(art, node256_leaf);
}